

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::jsonStreamData(Config *this,string *parameter)

{
  int iVar1;
  string local_38;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  json_stream_data_set = true;
  iVar1 = std::__cxx11::string::compare((char *)parameter);
  if (iVar1 == 0) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    json_stream_data = qpdf_sj_none;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    if (iVar1 == 0) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      json_stream_data = qpdf_sj_inline;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)parameter);
      if (iVar1 == 0) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        json_stream_data = qpdf_sj_file;
      }
      else {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"invalid json-streams option","");
        usage(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jsonStreamData(std::string const& parameter)
{
    o.m->json_stream_data_set = true;
    if (parameter == "none") {
        o.m->json_stream_data = qpdf_sj_none;
    } else if (parameter == "inline") {
        o.m->json_stream_data = qpdf_sj_inline;
    } else if (parameter == "file") {
        o.m->json_stream_data = qpdf_sj_file;
    } else {
        usage("invalid json-streams option");
    }

    return this;
}